

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O1

void Abc_NtkFraigStoreClean(void)

{
  Vec_Ptr_t *pVVar1;
  long lVar2;
  
  pVVar1 = Abc_FrameReadStore();
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      Abc_NtkDelete((Abc_Ntk_t *)pVVar1->pArray[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < pVVar1->nSize);
  }
  pVVar1->nSize = 0;
  return;
}

Assistant:

void Abc_NtkFraigStoreClean()
{
    Vec_Ptr_t * vStore;
    Abc_Ntk_t * pNtk;
    int i;
    vStore = Abc_FrameReadStore();
    Vec_PtrForEachEntry( Abc_Ntk_t *, vStore, pNtk, i )
        Abc_NtkDelete( pNtk );
    Vec_PtrClear( vStore );
}